

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_registry.cc
# Opt level: O0

void __thiscall
test_registry_minimal_keeps_alias_persistent_flag::test_method
          (test_registry_minimal_keeps_alias_persistent_flag *this)

{
  undefined8 uVar1;
  type_conflict tVar2;
  bool bVar3;
  lazy_ostream *plVar4;
  basic_cstring<const_char> local_480;
  basic_cstring<const_char> local_470;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_460;
  assertion_result local_440;
  basic_cstring<const_char> local_428;
  basic_cstring<const_char> local_418;
  basic_cstring<const_char> local_408;
  basic_cstring<const_char> local_3f8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_3e8;
  iterator_facade<Typelib::RegistryIterator,_const_Typelib::Type,_boost::iterators::forward_traversal_tag,_const_Typelib::Type_&,_long>
  local_3c8 [16];
  assertion_result local_3b8;
  basic_cstring<const_char> local_3a0;
  basic_cstring<const_char> local_390;
  allocator local_379;
  string local_378 [32];
  string local_358 [8];
  RegistryIterator it_1;
  basic_cstring<const_char> local_348;
  basic_cstring<const_char> local_338;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_328;
  assertion_result local_308;
  basic_cstring<const_char> local_2f0;
  basic_cstring<const_char> local_2e0;
  basic_cstring<const_char> local_2d0;
  basic_cstring<const_char> local_2c0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_2b0;
  iterator_facade<Typelib::RegistryIterator,_const_Typelib::Type,_boost::iterators::forward_traversal_tag,_const_Typelib::Type_&,_long>
  local_290 [16];
  assertion_result local_280;
  basic_cstring<const_char> local_268;
  basic_cstring<const_char> local_258;
  allocator local_241;
  string local_240 [32];
  string local_220 [8];
  RegistryIterator it;
  allocator local_209;
  string local_208 [39];
  allocator local_1e1;
  string local_1e0 [39];
  allocator local_1b9;
  string local_1b8 [39];
  allocator local_191;
  string local_190 [39];
  allocator local_169;
  string local_168 [39];
  allocator local_141;
  string local_140 [32];
  Registry local_120 [8];
  Registry target;
  Registry local_90 [8];
  Registry registry;
  test_registry_minimal_keeps_alias_persistent_flag *this_local;
  
  Typelib::Registry::Registry(local_90);
  Typelib::CXX::addStandardTypes(local_90);
  Typelib::Registry::Registry(local_120);
  Typelib::CXX::addStandardTypes(local_120);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"/int",&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"/Persistent",&local_169);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_190,"",&local_191);
  Typelib::Registry::alias((string *)local_120,local_140,SUB81(local_168,0),(string *)0x1);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,"/int",&local_1b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,"/Temporary",&local_1e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_208,"",&local_209);
  Typelib::Registry::alias((string *)local_120,local_1b8,SUB81(local_1e0,0),(string *)0x0);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  Typelib::Registry::minimal(local_120,SUB81(local_90,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_240,"/Persistent",&local_241);
  Typelib::Registry::find(local_220);
  std::__cxx11::string::~string(local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_258,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_268);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_258,0x10d,&local_268);
    Typelib::Registry::end();
    tVar2 = boost::iterators::operator!=
                      ((iterator_facade<Typelib::RegistryIterator,_const_Typelib::Type,_boost::iterators::forward_traversal_tag,_const_Typelib::Type_&,_long>
                        *)local_220,local_290);
    boost::test_tools::assertion_result::assertion_result(&local_280,tVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2c0,"it != target.end()",0x12);
    boost::unit_test::operator<<(&local_2b0,plVar4,&local_2c0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2d0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::test_tools::tt_detail::report_assertion(&local_280,&local_2b0,&local_2d0,0x10d,2,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_2b0);
    boost::test_tools::assertion_result::~assertion_result(&local_280);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2e0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2f0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_2e0,0x10e,&local_2f0);
    bVar3 = Typelib::RegistryIterator::isPersistent((RegistryIterator *)local_220);
    boost::test_tools::assertion_result::assertion_result(&local_308,bVar3);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_338,"it.isPersistent()",0x11);
    boost::unit_test::operator<<(&local_328,plVar4,&local_338);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_348,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::test_tools::tt_detail::report_assertion(&local_308,&local_328,&local_348,0x10e,2,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_328);
    boost::test_tools::assertion_result::~assertion_result(&local_308);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_378,"/Temporary",&local_379);
  Typelib::Registry::find(local_358);
  std::__cxx11::string::~string(local_378);
  std::allocator<char>::~allocator((allocator<char> *)&local_379);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_390,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_390,0x112,&local_3a0);
    Typelib::Registry::end();
    tVar2 = boost::iterators::operator!=
                      ((iterator_facade<Typelib::RegistryIterator,_const_Typelib::Type,_boost::iterators::forward_traversal_tag,_const_Typelib::Type_&,_long>
                        *)local_358,local_3c8);
    boost::test_tools::assertion_result::assertion_result(&local_3b8,tVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3f8,"it != target.end()",0x12);
    boost::unit_test::operator<<(&local_3e8,plVar4,&local_3f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_408,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::test_tools::tt_detail::report_assertion(&local_3b8,&local_3e8,&local_408,0x112,2,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_3e8);
    boost::test_tools::assertion_result::~assertion_result(&local_3b8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_418,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_428);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_418,0x113,&local_428);
    bVar3 = Typelib::RegistryIterator::isPersistent((RegistryIterator *)local_358);
    boost::test_tools::assertion_result::assertion_result(&local_440,(bool)(~bVar3 & 1));
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_470,"!it.isPersistent()",0x12);
    boost::unit_test::operator<<(&local_460,plVar4,&local_470);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_480,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_registry.cc"
               ,0x69);
    boost::test_tools::tt_detail::report_assertion(&local_440,&local_460,&local_480,0x113,2,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_460);
    boost::test_tools::assertion_result::~assertion_result(&local_440);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  Typelib::Registry::~Registry(local_120);
  Typelib::Registry::~Registry(local_90);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( test_registry_minimal_keeps_alias_persistent_flag )
{
    Registry registry;
    Typelib::CXX::addStandardTypes(registry);
    Registry target;
    Typelib::CXX::addStandardTypes(target);
    target.alias("/int", "/Persistent", true);
    target.alias("/int", "/Temporary", false);

    target.minimal(registry);
    { RegistryIterator it = target.find("/Persistent");
        BOOST_REQUIRE(it != target.end());
        BOOST_REQUIRE(it.isPersistent());
    }

    { RegistryIterator it = target.find("/Temporary");
        BOOST_REQUIRE(it != target.end());
        BOOST_REQUIRE(!it.isPersistent());
    }
}